

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::DoSimdShift<unsigned_int,unsigned_int>
          (Thread *this,BinopFunc<unsigned_int,_unsigned_int> *f)

{
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  byte local_3d;
  undefined1 auStack_3c [7];
  u8 i;
  SR result;
  Simd<unsigned_int,_(unsigned_char)__x04_> lhs;
  uint amount;
  BinopFunc<unsigned_int,_unsigned_int> *f_local;
  Thread *this_local;
  
  uVar1 = Pop<unsigned_int>(this);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this);
  for (local_3d = 0; local_3d < 4; local_3d = local_3d + 1) {
    puVar3 = Simd<unsigned_int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<unsigned_int,_(unsigned_char)__x04_> *)(result.v + 2),local_3d);
    uVar2 = (*f)(*puVar3,uVar1);
    puVar3 = Simd<unsigned_int,_(unsigned_char)'\x04'>::operator[]
                       ((Simd<unsigned_int,_(unsigned_char)__x04_> *)auStack_3c,local_3d);
    *puVar3 = uVar2;
  }
  value.v[2] = result.v[0];
  value.v[3] = result.v[1];
  value.v[0] = auStack_3c._0_4_;
  value.v[1] = stack0xffffffffffffffc8;
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShift(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto amount = Pop<u32>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], amount);
  }
  Push(result);
  return RunResult::Ok;
}